

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::ListDistanceFun::GetFunctions(void)

{
  bool bVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::ScalarFunction,_true> *__range1_1;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *set;
  LogicalType *in_stack_000003a8;
  ScalarFunctionSet *in_stack_000003b0;
  ScalarFunctionSet *__lhs;
  BaseScalarFunction local_150 [176];
  reference local_a0;
  ScalarFunction *local_98;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_90;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_88;
  reference local_80;
  LogicalType *local_78;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"list_distance",&local_31);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  duckdb::LogicalType::Real();
  local_50 = local_68;
  local_70._M_current =
       (LogicalType *)
       std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDI);
  local_78 = (LogicalType *)
             std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDI)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)__lhs,(__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                                      *)in_RDI), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
               ::operator*(&local_70);
    AddListFoldFunction<duckdb::DistanceOp>(in_stack_000003b0,in_stack_000003a8);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(&local_70);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd5106c);
  local_88 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)in_RDI +
             0x20;
  local_90._M_current =
       (ScalarFunction *)
       std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin
                 ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)in_RDI)
  ;
  local_98 = (ScalarFunction *)
             std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                       ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                        in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)__lhs,(__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                                      *)in_RDI), bVar1) {
    local_a0 = __gnu_cxx::
               __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
               ::operator*(&local_90);
    BaseScalarFunction::SetReturnsError((BaseScalarFunction *)in_RDI);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_150);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_90);
  }
  return __lhs;
}

Assistant:

ScalarFunctionSet ListDistanceFun::GetFunctions() {
	ScalarFunctionSet set("list_distance");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<DistanceOp>(set, type);
	}
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}